

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iSWAP.hpp
# Opt level: O2

void __thiscall
qclab::qgates::iSWAP<std::complex<float>_>::iSWAP(iSWAP<std::complex<float>_> *this,int *qubits)

{
  (this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_004d0b80;
  setQubits(this,qubits);
  return;
}

Assistant:

iSWAP( const int* qubits )
        {
          setQubits( qubits ) ;
        }